

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O0

void helper_idivb_AL_x86_64(CPUX86State *env,target_ulong t0)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uintptr_t unaff_retaddr;
  int r;
  int q;
  int den;
  int num;
  target_ulong t0_local;
  CPUX86State *env_local;
  
  iVar1 = (int)(short)env->regs[0];
  iVar2 = (int)(char)t0;
  if (iVar2 == 0) {
    raise_exception_ra_x86_64(env,0,unaff_retaddr);
  }
  uVar3 = iVar1 / iVar2;
  if (uVar3 != (int)(char)uVar3) {
    raise_exception_ra_x86_64(env,0,unaff_retaddr);
  }
  env->regs[0] = env->regs[0] & 0xffffffffffff0000 | (long)(int)((iVar1 % iVar2 & 0xffU) << 8) |
                 (long)(int)(uVar3 & 0xff);
  return;
}

Assistant:

void helper_idivb_AL(CPUX86State *env, target_ulong t0)
{
    int num, den, q, r;

    num = (int16_t)env->regs[R_EAX];
    den = (int8_t)t0;
    if (den == 0) {
        raise_exception_ra(env, EXCP00_DIVZ, GETPC());
    }
    q = (num / den);
    if (q != (int8_t)q) {
        raise_exception_ra(env, EXCP00_DIVZ, GETPC());
    }
    q &= 0xff;
    r = (num % den) & 0xff;
    env->regs[R_EAX] = (env->regs[R_EAX] & ~0xffff) | (r << 8) | q;
}